

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserFilter.cpp
# Opt level: O2

bool __thiscall
Rml::PropertyParserFilter::ParseValue
          (PropertyParserFilter *this,Property *property,String *filter_string_value,
          ParameterMap *param_3)

{
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  FilterInstancer *pFVar6;
  PropertySpecification *this_00;
  pointer pbVar7;
  allocator<char> local_171;
  pointer local_170;
  PropertyDictionary properties;
  StringList filter_string_list;
  FilterDeclarationList filters;
  undefined1 local_c8 [72];
  size_t local_80;
  undefined8 uStack_78;
  String shorthand;
  String type;
  
  if ((filter_string_value->_M_string_length == 0) ||
     (bVar3 = ::std::operator==(filter_string_value,"none"), bVar3)) {
    filters.list.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    filters.list.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Variant::Variant<std::shared_ptr<Rml::FilterDeclarationList_const>,void>
              ((Variant *)local_c8,(shared_ptr<const_Rml::FilterDeclarationList> *)&filters);
    Variant::operator=(&property->value,(Variant *)local_c8);
    Variant::~Variant((Variant *)local_c8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &filters.list.
                super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    property->unit = FILTER;
    return true;
  }
  filter_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filter_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filter_string_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  StringUtilities::ExpandString(&filter_string_list,filter_string_value,' ','(',')',true);
  filters.list.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  filters.list.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filters.list.super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filters.value._M_dataplus._M_p = (pointer)&filters.value.field_2;
  filters.value._M_string_length = 0;
  filters.value.field_2._M_local_buf[0] = '\0';
  ::std::__cxx11::string::_M_assign((string *)&filters.value);
  ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::reserve
            (&filters.list,
             (long)filter_string_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)filter_string_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  pbVar1 = filter_string_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar7 = filter_string_list.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == pbVar1) {
      if (filters.list.
          super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          filters.list.
          super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
LAB_002b76d3:
        bVar3 = false;
      }
      else {
        ::std::make_shared<Rml::FilterDeclarationList,Rml::FilterDeclarationList>
                  ((FilterDeclarationList *)&properties);
        Variant::Variant<std::shared_ptr<Rml::FilterDeclarationList>,void>
                  ((Variant *)local_c8,(shared_ptr<Rml::FilterDeclarationList> *)&properties);
        Variant::operator=(&property->value,(Variant *)local_c8);
        Variant::~Variant((Variant *)local_c8);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&properties.properties.mInfo);
        property->unit = FILTER;
        bVar3 = true;
      }
LAB_002b76d5:
      FilterDeclarationList::~FilterDeclarationList(&filters);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&filter_string_list);
      return bVar3;
    }
    uVar4 = ::std::__cxx11::string::find((char)pbVar7,0x28);
    uVar5 = ::std::__cxx11::string::rfind((char)pbVar7,0x29);
    if ((uVar5 <= uVar4) || (uVar5 == 0xffffffffffffffff)) {
      bVar3 = false;
      Log::Message(LT_WARNING,"Invalid syntax for font-effect \'%s\'.",(pbVar7->_M_dataplus)._M_p);
      goto LAB_002b76d5;
    }
    ::std::__cxx11::string::substr((ulong)local_c8,(ulong)pbVar7);
    local_170 = pbVar7;
    StringUtilities::StripWhitespace(&type,(String *)local_c8);
    ::std::__cxx11::string::~string((string *)local_c8);
    pFVar6 = Factory::GetFilterInstancer(&type);
    if (pFVar6 == (FilterInstancer *)0x0) {
      Log::Message(LT_WARNING,"Filter type \'%s\' not found.",type._M_dataplus._M_p);
LAB_002b76c6:
      ::std::__cxx11::string::~string((string *)&type);
      goto LAB_002b76d3;
    }
    ::std::__cxx11::string::substr((ulong)&shorthand,(ulong)local_170);
    this_00 = EffectSpecification::GetPropertySpecification(&pFVar6->super_EffectSpecification);
    PropertyDictionary::PropertyDictionary(&properties);
    ::std::__cxx11::string::string<std::allocator<char>>((string *)local_c8,"filter",&local_171);
    bVar3 = PropertySpecification::ParsePropertyDeclaration
                      (this_00,&properties,(String *)local_c8,&shorthand);
    ::std::__cxx11::string::~string((string *)local_c8);
    if (!bVar3) {
      StringUtilities::StripWhitespace((String *)local_c8,&shorthand);
      uVar2 = local_c8._8_8_;
      ::std::__cxx11::string::~string((string *)local_c8);
      if (uVar2 != 0) {
        robin_hood::detail::
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::destroy(&properties.properties);
        ::std::__cxx11::string::~string((string *)&shorthand);
        goto LAB_002b76c6;
      }
    }
    PropertySpecification::SetPropertyDefaults(this_00,(PropertyDictionary *)&properties.properties)
    ;
    ::std::__cxx11::string::string((string *)local_c8,(string *)&type);
    local_c8._40_8_ = local_c8 + 0x40;
    local_80 = 0;
    local_c8._56_8_ = 0;
    local_c8._64_8_ = 0;
    uStack_78._0_4_ = 0x20;
    uStack_78._4_4_ = 0;
    local_c8._48_8_ = local_c8._40_8_;
    if (properties.properties.mMask != 0) {
      local_c8._40_8_ = properties.properties.mKeyVals;
      local_c8._48_8_ = properties.properties.mInfo;
      local_c8._56_8_ = properties.properties.mNumElements;
      local_c8._64_8_ = properties.properties.mMask;
      local_80 = properties.properties.mMaxNumElementsAllowed;
      uStack_78._0_4_ = properties.properties.mInfoInc;
      uStack_78._4_4_ = properties.properties.mInfoHashShift;
      properties.properties.mKeyVals = (Node *)&properties.properties.mMask;
      properties.properties.mNumElements = 0;
      properties.properties.mMask = 0;
      properties.properties.mMaxNumElementsAllowed = 0;
      properties.properties.mInfoInc = 0x20;
      properties.properties.mInfoHashShift = 0;
      properties.properties.mInfo = (uint8_t *)properties.properties.mKeyVals;
    }
    local_c8._32_8_ = pFVar6;
    ::std::vector<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>::
    emplace_back<Rml::FilterDeclaration>(&filters.list,(FilterDeclaration *)local_c8);
    FilterDeclaration::~FilterDeclaration((FilterDeclaration *)local_c8);
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::destroy(&properties.properties);
    ::std::__cxx11::string::~string((string *)&shorthand);
    ::std::__cxx11::string::~string((string *)&type);
    pbVar7 = local_170 + 1;
  } while( true );
}

Assistant:

bool PropertyParserFilter::ParseValue(Property& property, const String& filter_string_value, const ParameterMap& /*parameters*/) const
{
	// Filters are declared as
	//   filter: <filter-value>[ <filter-value> ...];
	// Where <filter-value> is specified with inline properties
	//   filter: brightness( <shorthand properties> ) ...;

	if (filter_string_value.empty() || filter_string_value == "none")
	{
		property.value = Variant(FiltersPtr());
		property.unit = Unit::FILTER;
		return true;
	}

	RMLUI_ZoneScoped;

	// Make sure we don't split inside the parenthesis since they may appear in filter shorthands.
	StringList filter_string_list;
	StringUtilities::ExpandString(filter_string_list, filter_string_value, ' ', '(', ')', true);

	FilterDeclarationList filters;
	filters.value = filter_string_value;
	filters.list.reserve(filter_string_list.size());

	// Get or instance each filter in the comma-separated string list
	for (const String& filter_string : filter_string_list)
	{
		const size_t shorthand_open = filter_string.find('(');
		const size_t shorthand_close = filter_string.rfind(')');
		const bool invalid_parenthesis = (shorthand_open == String::npos || shorthand_close == String::npos || shorthand_open >= shorthand_close);

		if (invalid_parenthesis)
		{
			// We found no parenthesis, filters can only be declared anonymously for now.
			Log::Message(Log::LT_WARNING, "Invalid syntax for font-effect '%s'.", filter_string.c_str());
			return false;
		}
		else
		{
			const String type = StringUtilities::StripWhitespace(filter_string.substr(0, shorthand_open));

			// Check for valid filter type
			FilterInstancer* instancer = Factory::GetFilterInstancer(type);
			if (!instancer)
			{
				Log::Message(Log::LT_WARNING, "Filter type '%s' not found.", type.c_str());
				return false;
			}

			const String shorthand = filter_string.substr(shorthand_open + 1, shorthand_close - shorthand_open - 1);
			const PropertySpecification& specification = instancer->GetPropertySpecification();

			// Parse the shorthand properties given by the 'filter' shorthand property
			PropertyDictionary properties;
			if (!specification.ParsePropertyDeclaration(properties, "filter", shorthand))
			{
				// Empty values are allowed in filters, if the value is not empty we must have encountered a parser error.
				if (!StringUtilities::StripWhitespace(shorthand).empty())
					return false;
			}

			// Set unspecified values to their defaults
			specification.SetPropertyDefaults(properties);

			filters.list.emplace_back(FilterDeclaration{type, instancer, std::move(properties)});
		}
	}

	if (filters.list.empty())
		return false;

	property.value = Variant(MakeShared<FilterDeclarationList>(std::move(filters)));
	property.unit = Unit::FILTER;

	return true;
}